

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Expression> __thiscall Parser::conjunction(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var1;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Parser *in_RSI;
  ptr<Expression> pVar4;
  undefined1 local_49;
  _Alloc_hider local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  shared_ptr<Conjunction> local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  equality(this);
  bVar2 = match(in_RSI,And);
  _Var3._M_pi = extraout_RDX;
  if (bVar2) {
    consume(in_RSI);
    local_30.super___shared_ptr<Conjunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    (local_30.super___shared_ptr<Conjunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 1;
    (local_30.super___shared_ptr<Conjunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = 1;
    (local_30.super___shared_ptr<Conjunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012fc40;
    local_30.super___shared_ptr<Conjunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_30.super___shared_ptr<Conjunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1
         );
    local_30.super___shared_ptr<Conjunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = (_func_int **)&PTR_asStrings_0012fc90;
    conjunction((Parser *)&stack0xffffffffffffffe0);
    local_48._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<BinaryOperator,std::allocator<BinaryOperator>,std::shared_ptr<Conjunction>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
              (a_Stack_40,(BinaryOperator **)&local_48,(allocator<BinaryOperator> *)&local_49,
               &local_30,(shared_ptr<Expression> *)this,
               (shared_ptr<Expression> *)&stack0xffffffffffffffe0);
    _Var3._M_pi = a_Stack_40[0]._M_pi;
    _Var1._M_p = local_48._M_p;
    local_48._M_p = (pointer)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->filepath)._M_string_length;
    (this->filepath)._M_dataplus._M_p = _Var1._M_p;
    (this->filepath)._M_string_length = (size_type)_Var3._M_pi;
    _Var3._M_pi = extraout_RDX_00;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var3._M_pi = extraout_RDX_01;
      if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
        _Var3._M_pi = extraout_RDX_02;
      }
    }
    if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
      _Var3._M_pi = extraout_RDX_03;
    }
    if (local_30.super___shared_ptr<Conjunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<Conjunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      _Var3._M_pi = extraout_RDX_04;
    }
  }
  pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::conjunction() {
    ptr<Expression> expr = equality();

    if(match(TokenType::And)) {
        consume();
        expr = make<BinaryOperator>(make<Conjunction>(), expr, conjunction());
    }

    return expr;
}